

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

void __thiscall
irr::core::array<irr::core::string<unsigned_long>_>::reallocate
          (array<irr::core::string<unsigned_long>_> *this,u32 new_size)

{
  string<unsigned_long> *psVar1;
  void *pvVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  psVar1 = this->data;
  lVar6 = (ulong)new_size * 0x10;
  puVar3 = (ulong *)operator_new__(lVar6 + 8);
  *puVar3 = (ulong)new_size;
  if (new_size != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar5 + 8) = 0;
      *(undefined8 *)((long)puVar3 + lVar5 + 0x10) = 0x100000001;
      puVar4 = (undefined8 *)operator_new__(8);
      *(undefined8 **)((long)puVar3 + lVar5 + 8) = puVar4;
      *puVar4 = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 != lVar5);
  }
  this->data = (string<unsigned_long> *)(puVar3 + 1);
  this->allocated = new_size;
  if (this->used < new_size) {
    new_size = this->used;
  }
  if (0 < (int)new_size) {
    uVar7 = (ulong)new_size;
    lVar6 = 0;
    do {
      string<unsigned_long>::operator=
                ((string<unsigned_long> *)((long)&this->data->array + lVar6),
                 (string<unsigned_long> *)((long)&psVar1->array + lVar6));
      lVar6 = lVar6 + 0x10;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (psVar1 != (string<unsigned_long> *)0x0) {
    lVar6._0_4_ = psVar1[-1].allocated;
    lVar6._4_4_ = psVar1[-1].used;
    if (lVar6 != 0) {
      lVar6 = lVar6 << 4;
      do {
        pvVar2 = *(void **)((long)&psVar1[-1].array + lVar6);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
    }
    operator_delete__(&psVar1[-1].allocated);
    return;
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}